

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

Result __thiscall wabt::OutputBuffer::WriteToStdout(OutputBuffer *this)

{
  FILE *__stream;
  bool bVar1;
  uchar *__ptr;
  size_type sVar2;
  size_t sVar3;
  ssize_t bytes;
  OutputBuffer *this_local;
  
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->data);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    sVar3 = fwrite(__ptr,1,sVar2,_stdout);
    if ((-1 < (long)sVar3) &&
       (sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data),
       sVar3 == sVar2)) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    __stream = _stderr;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    fprintf(__stream,"%s:%d: failed to write %zd bytes to stdout\n",
            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/stream.cc",
            0xa6,sVar2);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result OutputBuffer::WriteToStdout() const {
  if (data.empty()) {
    return Result::Ok;
  }
  ssize_t bytes = fwrite(data.data(), 1, data.size(), stdout);
  if (bytes < 0 || static_cast<size_t>(bytes) != data.size()) {
    ERROR("failed to write %" PRIzd " bytes to stdout\n", data.size());
    return Result::Error;
  }
  return Result::Ok;
}